

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

QTableWidgetItem * __thiscall QTableModel::takeHorizontalHeaderItem(QTableModel *this,int section)

{
  pointer ppQVar1;
  QTableWidgetItem *pQVar2;
  ulong uVar3;
  
  if (((section < 0) ||
      (uVar3 = (ulong)(uint)section, (ulong)(this->horizontalHeaderItems).d.size <= uVar3)) ||
     (pQVar2 = (this->horizontalHeaderItems).d.ptr[uVar3], pQVar2 == (QTableWidgetItem *)0x0)) {
    pQVar2 = (QTableWidgetItem *)0x0;
  }
  else {
    pQVar2->view = (QTableWidget *)0x0;
    pQVar2->d->headerItem = false;
    ppQVar1 = QList<QTableWidgetItem_*>::data(&this->horizontalHeaderItems);
    ppQVar1[uVar3] = (QTableWidgetItem *)0x0;
  }
  return pQVar2;
}

Assistant:

QTableWidgetItem *QTableModel::takeHorizontalHeaderItem(int section)
{
    if (section < 0 || section >= horizontalHeaderItems.size())
        return nullptr;
    QTableWidgetItem *itm = horizontalHeaderItems.at(section);
    if (itm) {
        itm->view = nullptr;
        itm->d->headerItem = false;
        horizontalHeaderItems[section] = 0;
    }
    return itm;
}